

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall slang::parsing::Lexer::scanLineComment(Lexer *this)

{
  bool bVar1;
  char c_00;
  Lexer *in_RDI;
  Lexer *unaff_retaddr;
  char c;
  Lexer *in_stack_00000008;
  bool sawUTF8Error;
  Lexer *in_stack_00000208;
  undefined2 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff2;
  byte bVar2;
  Lexer *pLVar3;
  TriviaKind kind;
  
  pLVar3 = in_RDI;
  bVar1 = tryApplyCommentHandler(in_stack_00000208);
  if (bVar1) {
    addTrivia(unaff_retaddr,(TriviaKind)((ulong)pLVar3 >> 0x38));
    return;
  }
  bVar2 = 0;
  do {
    while( true ) {
      c_00 = peek(in_RDI);
      bVar1 = isASCII(c_00);
      if (bVar1) break;
      bVar1 = scanUTF8Char((Lexer *)CONCAT17(bVar2,CONCAT16(c_00,CONCAT42(in_stack_fffffffffffffff2,
                                                                          in_stack_fffffffffffffff0)
                                                           )),SUB81((ulong)in_RDI >> 0x38,0));
      bVar2 = (bVar2 & 1) != 0 || ((bVar1 ^ 0xffU) & 1) != 0;
    }
    bVar1 = isNewline(c_00);
    kind = (TriviaKind)((ulong)pLVar3 >> 0x38);
    if (bVar1) goto LAB_0040b783;
    bVar2 = 0;
    if (c_00 == '\0') {
      bVar1 = reallyAtEnd(in_RDI);
      kind = (TriviaKind)((ulong)pLVar3 >> 0x38);
      if (bVar1) {
LAB_0040b783:
        addTrivia(unaff_retaddr,kind);
        return;
      }
      in_RDI->errorCount = in_RDI->errorCount + 1;
      in_stack_fffffffffffffff2 = 0x50002;
      currentOffset(in_RDI);
      addDiag(in_stack_00000008,this._4_4_,(size_t)unaff_retaddr);
    }
    advance(in_RDI);
  } while( true );
}

Assistant:

void Lexer::scanLineComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            if (isNewline(c))
                break;

            sawUTF8Error = false;
            if (c == '\0') {
                if (reallyAtEnd())
                    break;

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
            }
            advance();
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::LineComment);
}